

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

int gmath::anon_unknown_20::averageAngleAxisOpt(int n,double *x,int m,double *fvec,void *up)

{
  long in_RCX;
  int in_EDX;
  double *in_RSI;
  Matrix33d *in_R8;
  double dVar1;
  Matrix33d R;
  int i;
  Matrix33d Ra;
  Vector3d tmp;
  Vector3d *v;
  Vector3d *in_stack_fffffffffffffe88;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffe98;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffea0;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffea8;
  int local_f4;
  SVector<double,_3> local_f0 [7];
  Vector3d *in_stack_ffffffffffffffc8;
  
  SVector<double,_3>::SVector((SVector<double,_3> *)&stack0xffffffffffffffb8);
  SVector<double,_3>::SVector(local_f0,*in_RSI,in_RSI[1],in_RSI[2]);
  createR(in_stack_fffffffffffffe88);
  transpose<double,3,3>(in_stack_fffffffffffffe98);
  for (local_f4 = 0; local_f4 < in_EDX; local_f4 = local_f4 + 1) {
    createR(in_stack_fffffffffffffe88);
    operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    dVar1 = recoverAngleAxis(in_R8,in_stack_ffffffffffffffc8);
    *(double *)(in_RCX + (long)local_f4 * 8) = dVar1;
  }
  return 0;
}

Assistant:

int averageAngleAxisOpt(int n, double x[], int m, double fvec[], void *up)
{
  Vector3d *v=reinterpret_cast<Vector3d *>(up);
  Vector3d tmp;

  Matrix33d Ra=transpose(createR(Vector3d(x[0], x[1], x[2])));

  for (int i=0; i<m; i++)
  {
    Matrix33d R=createR(v[i]);
    fvec[i]=recoverAngleAxis(Ra*R, tmp);
  }

  return 0;
}